

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::PoolingParameter::InternalSwap(PoolingParameter *this,PoolingParameter *other)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  void *pvVar4;
  UnknownFieldSet *other_00;
  
  iVar2 = this->pool_;
  this->pool_ = other->pool_;
  other->pool_ = iVar2;
  uVar3 = this->kernel_size_;
  this->kernel_size_ = other->kernel_size_;
  other->kernel_size_ = uVar3;
  uVar3 = this->pad_;
  this->pad_ = other->pad_;
  other->pad_ = uVar3;
  uVar3 = this->kernel_h_;
  this->kernel_h_ = other->kernel_h_;
  other->kernel_h_ = uVar3;
  uVar3 = this->kernel_w_;
  this->kernel_w_ = other->kernel_w_;
  other->kernel_w_ = uVar3;
  uVar3 = this->stride_h_;
  this->stride_h_ = other->stride_h_;
  other->stride_h_ = uVar3;
  uVar3 = this->stride_w_;
  this->stride_w_ = other->stride_w_;
  other->stride_w_ = uVar3;
  uVar3 = this->pad_h_;
  this->pad_h_ = other->pad_h_;
  other->pad_h_ = uVar3;
  uVar3 = this->pad_w_;
  this->pad_w_ = other->pad_w_;
  other->pad_w_ = uVar3;
  iVar2 = this->engine_;
  this->engine_ = other->engine_;
  other->engine_ = iVar2;
  bVar1 = this->global_pooling_;
  this->global_pooling_ = other->global_pooling_;
  other->global_pooling_ = bVar1;
  uVar3 = this->stride_;
  this->stride_ = other->stride_;
  other->stride_ = uVar3;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_004a564b;
LAB_004a563e:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_004a563e;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004a564b:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void PoolingParameter::InternalSwap(PoolingParameter* other) {
  std::swap(pool_, other->pool_);
  std::swap(kernel_size_, other->kernel_size_);
  std::swap(pad_, other->pad_);
  std::swap(kernel_h_, other->kernel_h_);
  std::swap(kernel_w_, other->kernel_w_);
  std::swap(stride_h_, other->stride_h_);
  std::swap(stride_w_, other->stride_w_);
  std::swap(pad_h_, other->pad_h_);
  std::swap(pad_w_, other->pad_w_);
  std::swap(engine_, other->engine_);
  std::swap(global_pooling_, other->global_pooling_);
  std::swap(stride_, other->stride_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}